

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_gas_breath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int dam;
  int iVar3;
  int dam_00;
  CHAR_DATA *victim;
  
  act("$n breathes out a cloud of poisonous gas!",ch,(void *)0x0,(void *)0x0,0);
  act("You breath out a cloud of poisonous gas.",ch,(void *)0x0,(void *)0x0,3);
  dam = dice(level,5);
  poison_effect(ch->in_room,level,dam,2);
  victim = ch->in_room->people;
  if (victim != (CHAR_DATA *)0x0) {
    iVar3 = dam + 3;
    if (-1 < dam) {
      iVar3 = dam;
    }
    do {
      pCVar1 = victim->next_in_room;
      bVar2 = is_safe(ch,victim);
      if ((!bVar2) || (victim->fighting == (CHAR_DATA *)0x0 || victim->fighting == ch)) {
        bVar2 = is_same_group(ch,victim);
        if (!bVar2) {
          bVar2 = saves_spell(level,victim,8);
          if (bVar2) {
            poison_effect(victim,level / 2,iVar3 >> 2,0);
            dam_00 = dam / 2;
          }
          else {
            poison_effect(victim,level,dam,0);
            dam_00 = dam;
          }
          damage_old(ch,victim,dam_00,sn,8,true);
        }
      }
      victim = pCVar1;
    } while (pCVar1 != (CHAR_DATA *)0x0);
  }
  return;
}

Assistant:

void spell_gas_breath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	int dam;

	act("$n breathes out a cloud of poisonous gas!", ch, nullptr, nullptr, TO_ROOM);
	act("You breath out a cloud of poisonous gas.", ch, nullptr, nullptr, TO_CHAR);

	dam = dice(level, 5);

	poison_effect(ch->in_room, level, dam, TARGET_ROOM);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_safe(ch, vch) && vch->fighting != nullptr && vch->fighting != ch)
			continue;

		if (is_same_group(ch, vch))
			continue;

		if (saves_spell(level, vch, DAM_POISON))
		{
			poison_effect(vch, level / 2, dam / 4, TARGET_CHAR);
			damage_old(ch, vch, dam / 2, sn, DAM_POISON, true);
		}
		else
		{
			poison_effect(vch, level, dam, TARGET_CHAR);
			damage_old(ch, vch, dam, sn, DAM_POISON, true);
		}
	}
}